

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DeleteProperty(JSContext *ctx,JSValue obj,JSAtom prop,int flags)

{
  int iVar1;
  BOOL BVar2;
  JSContext *in_RDI;
  uint in_R8D;
  JSValue JVar3;
  JSAtom in_stack_0000001c;
  JSObject *in_stack_00000020;
  int res;
  JSObject *p;
  JSValue obj1;
  JSContext *local_68;
  int local_4;
  
  JVar3.tag._0_4_ = flags;
  JVar3.u = (JSValueUnion)obj1.tag;
  JVar3.tag._4_4_ = prop;
  JVar3 = JS_ToObject((JSContext *)obj1.u.ptr,JVar3);
  iVar1 = JS_IsException(JVar3);
  if (iVar1 == 0) {
    local_4 = delete_property((JSContext *)p,in_stack_00000020,in_stack_0000001c);
    JS_FreeValue(local_68,JVar3);
    if (local_4 == 0) {
      if (((in_R8D & 0x4000) == 0) &&
         (((in_R8D & 0x8000) == 0 || (BVar2 = is_strict_mode(in_RDI), BVar2 == 0)))) {
        local_4 = 0;
      }
      else {
        JS_ThrowTypeError(in_RDI,"could not delete property");
        local_4 = -1;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int JS_DeleteProperty(JSContext *ctx, JSValueConst obj, JSAtom prop, int flags)
{
    JSValue obj1;
    JSObject *p;
    int res;
    
    obj1 = JS_ToObject(ctx, obj);
    if (JS_IsException(obj1))
        return -1;
    p = JS_VALUE_GET_OBJ(obj1);
    res = delete_property(ctx, p, prop);
    JS_FreeValue(ctx, obj1);
    if (res != FALSE)
        return res;
    if ((flags & JS_PROP_THROW) ||
        ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
        JS_ThrowTypeError(ctx, "could not delete property");
        return -1;
    }
    return FALSE;
}